

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O3

string * gmlc::networking::addProtocol
                   (string *__return_storage_ptr__,string *networkAddress,InterfaceTypes interfaceT)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     networkAddress,"://",0,3);
  if (sVar4 == 0xffffffffffffffff) {
    switch(interfaceT) {
    case TCP:
    case IP:
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"tcp://","");
      pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_40,(networkAddress->_M_dataplus)._M_p,
                           networkAddress->_M_string_length);
      break;
    case UDP:
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"udp://","");
      pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_40,(networkAddress->_M_dataplus)._M_p,
                           networkAddress->_M_string_length);
      break;
    case IPC:
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ipc://","");
      pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_40,(networkAddress->_M_dataplus)._M_p,
                           networkAddress->_M_string_length);
      break;
    case INPROC:
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"inproc://","");
      pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_40,(networkAddress->_M_dataplus)._M_p,
                           networkAddress->_M_string_length);
      break;
    default:
      goto switchD_003d07be_default;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar6) {
      uVar3 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
switchD_003d07be_default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (networkAddress->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + networkAddress->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    addProtocol(const std::string& networkAddress, InterfaceTypes interfaceT)
{
    if (networkAddress.find("://") == std::string::npos) {
        switch (interfaceT) {
            case InterfaceTypes::IP:
            case InterfaceTypes::TCP:
                return std::string("tcp://") + networkAddress;
            case InterfaceTypes::IPC:
                return std::string("ipc://") + networkAddress;
            case InterfaceTypes::UDP:
                return std::string("udp://") + networkAddress;
            case InterfaceTypes::INPROC:
                return std::string("inproc://") + networkAddress;
        }
    }
    return networkAddress;
}